

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1write.cpp
# Opt level: O0

int mbedtls_asn1_write_bitstring(uchar **p,uchar *start,uchar *buf,size_t bits)

{
  byte bVar1;
  ulong uVar2;
  uchar *start_00;
  uchar **p_00;
  long in_RCX;
  void *in_RDX;
  ulong in_RSI;
  ulong *in_RDI;
  size_t byte_len;
  size_t unused_bits;
  size_t len;
  size_t in_stack_ffffffffffffffb8;
  int local_4;
  
  start_00 = (uchar *)(in_RCX + 7U >> 3);
  p_00 = (uchar **)((long)start_00 * 8 - in_RCX);
  if ((*in_RDI < in_RSI) || ((uchar *)(*in_RDI - in_RSI) < start_00 + 1)) {
    local_4 = -0x6c;
  }
  else {
    if (start_00 != (uchar *)0x0) {
      start_00 = start_00 + -1;
      bVar1 = *(byte *)((long)in_RDX + (long)start_00);
      uVar2 = *in_RDI;
      *in_RDI = uVar2 - 1;
      *(byte *)(uVar2 - 1) = bVar1 & ((char)(1 << ((byte)p_00 & 0x1f)) - 1U ^ 0xff);
      *in_RDI = *in_RDI - (long)start_00;
      memcpy((void *)*in_RDI,in_RDX,(size_t)start_00);
    }
    uVar2 = *in_RDI;
    *in_RDI = uVar2 - 1;
    *(char *)(uVar2 - 1) = (char)p_00;
    local_4 = mbedtls_asn1_write_len_and_tag(p_00,start_00,in_stack_ffffffffffffffb8,'\0');
  }
  return local_4;
}

Assistant:

int mbedtls_asn1_write_bitstring(unsigned char **p, const unsigned char *start,
                                 const unsigned char *buf, size_t bits)
{
    size_t len = 0;
    size_t unused_bits, byte_len;

    byte_len = (bits + 7) / 8;
    unused_bits = (byte_len * 8) - bits;

    if (*p < start || (size_t) (*p - start) < byte_len + 1) {
        return MBEDTLS_ERR_ASN1_BUF_TOO_SMALL;
    }

    len = byte_len + 1;

    /* Write the bitstring. Ensure the unused bits are zeroed */
    if (byte_len > 0) {
        byte_len--;
        *--(*p) = buf[byte_len] & ~((0x1 << unused_bits) - 1);
        (*p) -= byte_len;
        memcpy(*p, buf, byte_len);
    }

    /* Write unused bits */
    *--(*p) = (unsigned char) unused_bits;

    return mbedtls_asn1_write_len_and_tag(p, start, len, MBEDTLS_ASN1_BIT_STRING);
}